

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O2

bool Js::SIMDBool32x4Operation::OpAllTrue<int>(SIMDValue *simd)

{
  undefined8 in_RDX;
  ulong uVar1;
  SIMDValue SVar2;
  
  SVar2.field_0.f64[1] = (Type)in_RDX;
  SVar2.field_0.f64[0] = (Type)(simd->field_0).i64[1];
  SVar2 = SIMDUtils::CanonicalizeToBools<int>((SIMDUtils *)(simd->field_0).f64[0],SVar2);
  uVar1 = SVar2.field_0._8_8_;
  return (ushort)((ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 7,0) & 1) |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161((undefined1  [16])SVar2.field_0 >> 0x3f,0) & 1) << 7 |
                  (ushort)((byte)(uVar1 >> 7) & 1) << 8 | (ushort)((byte)(uVar1 >> 0xf) & 1) << 9 |
                  (ushort)((byte)(uVar1 >> 0x17) & 1) << 10 |
                  (ushort)((byte)(uVar1 >> 0x1f) & 1) << 0xb |
                  (ushort)((byte)(uVar1 >> 0x27) & 1) << 0xc |
                  (ushort)((byte)(uVar1 >> 0x2f) & 1) << 0xd |
                  (ushort)((byte)(uVar1 >> 0x37) & 1) << 0xe |
                 (ushort)(byte)(SVar2.field_0._15_1_ >> 7) << 0xf) == 0xffff;
}

Assistant:

bool SIMDBool32x4Operation::OpAllTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 == 0xFFFF;
    }